

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

connectdata * allocate_conn(Curl_easy *data)

{
  size_t sVar1;
  ssl_backend_data *psVar2;
  void *pvVar3;
  curl_sockopt_callback p_Var4;
  _Bool _Var5;
  curltime cVar6;
  byte local_6b;
  undefined4 uStack_44;
  undefined4 uStack_34;
  char *ssl;
  size_t sslsize;
  connectdata *conn;
  Curl_easy *data_local;
  
  data_local = (Curl_easy *)(*Curl_ccalloc)(1,0x768);
  if (data_local == (Curl_easy *)0x0) {
    return (connectdata *)(Curl_easy *)0x0;
  }
  sVar1 = Curl_ssl->sizeof_ssl_backend_data;
  psVar2 = (ssl_backend_data *)(*Curl_ccalloc)(4,sVar1);
  if (psVar2 == (ssl_backend_data *)0x0) {
    (*Curl_cfree)(data_local);
    return (connectdata *)(Curl_easy *)0x0;
  }
  *(ssl_backend_data **)((data_local->req).doh.probe[0].dohbuffer + 0xe4) = psVar2;
  *(ssl_backend_data **)((data_local->req).doh.probe[0].dohbuffer + 0x94) = psVar2;
  *(ssl_backend_data **)((data_local->req).doh.probe[0].dohbuffer + 0xac) =
       (ssl_backend_data *)((psVar2->tap_state).master_key + (sVar1 - 0x1c));
  *(ssl_backend_data **)((data_local->req).doh.probe[0].dohbuffer + 0xc4) =
       (ssl_backend_data *)((psVar2->tap_state).master_key + sVar1 * 2 + -0x1c);
  *(ssl_backend_data **)((data_local->req).doh.probe[0].dohbuffer + 0xdc) =
       (ssl_backend_data *)((psVar2->tap_state).master_key + sVar1 * 3 + -0x1c);
  *(Curl_handler **)((data_local->req).doh.probe[0].dohbuffer + 0x1d4) = &Curl_handler_dummy;
  *(curl_socket_t *)((data_local->req).doh.probe[0].dohbuffer + 0x4c) = -1;
  *(curl_socket_t *)((data_local->req).doh.probe[0].dohbuffer + 0x50) = -1;
  *(curl_socket_t *)((data_local->req).doh.probe[0].dohbuffer + 0x54) = -1;
  *(curl_socket_t *)((data_local->req).doh.probe[0].dohbuffer + 0x58) = -1;
  (data_local->msg).list.next = (curl_llist_element *)0xffffffffffffffff;
  (data_local->req).exp100 = ~EXP100_SEND_DATA;
  (data_local->req).upgr101 = ~UPGR101_INIT;
  *(int *)&(data_local->req).writer_stack = -1;
  Curl_conncontrol((connectdata *)data_local,1);
  cVar6 = Curl_now();
  ((curltime *)((data_local->req).doh.probe[0].dohbuffer + 0x3c))->tv_sec = cVar6.tv_sec;
  *(ulong *)((data_local->req).doh.probe[0].dohbuffer + 0x44) = CONCAT44(uStack_34,cVar6.tv_usec);
  cVar6 = Curl_now();
  ((curltime *)((data_local->req).doh.probe[0].dohbuffer + 0x1ec))->tv_sec = cVar6.tv_sec;
  *(ulong *)((data_local->req).doh.probe[0].dohbuffer + 500) = CONCAT44(uStack_44,cVar6.tv_usec);
  *(long *)((data_local->req).doh.probe[0].dohbuffer + 0x1fc) = (data->set).upkeep_interval_ms;
  data_local->next = data;
  (data_local->req).httpcode = (data->set).proxytype;
  *(curl_proxytype *)&(data_local->req).hbufp = CURLPROXY_SOCKS4;
  _Var5 = false;
  if ((data->set).str[0x15] != (char *)0x0) {
    _Var5 = *(data->set).str[0x15] != '\0';
  }
  (data_local->req).doh.probe[0].dohbuffer[0x191] = _Var5;
  _Var5 = false;
  if (((((data_local->req).doh.probe[0].dohbuffer[0x191] & 1) != 0) &&
      (_Var5 = true, (data_local->req).httpcode != CURLPROXY_HTTP)) &&
     (_Var5 = true, (data_local->req).httpcode != CURLPROXY_HTTP_1_0)) {
    _Var5 = (data_local->req).httpcode == CURLPROXY_HTTPS;
  }
  (data_local->req).doh.probe[0].dohbuffer[0x192] = _Var5;
  local_6b = 0;
  if (((data_local->req).doh.probe[0].dohbuffer[0x191] & 1) != 0) {
    local_6b = (data_local->req).doh.probe[0].dohbuffer[0x192] ^ 0xff;
  }
  (data_local->req).doh.probe[0].dohbuffer[0x193] = (local_6b & 1) != 0;
  if (((data->set).str[0x16] != (char *)0x0) && (*(data->set).str[0x16] != '\0')) {
    (data_local->req).doh.probe[0].dohbuffer[0x191] = true;
    (data_local->req).doh.probe[0].dohbuffer[0x193] = true;
  }
  (data_local->req).doh.probe[0].dohbuffer[0x195] = (data->set).str[0x2f] != (char *)0x0;
  (data_local->req).doh.probe[0].dohbuffer[0x19d] = (data->set).tunnel_thru_httpproxy & 1;
  (data_local->req).doh.probe[0].dohbuffer[0x194] = (data->set).str[0x2c] != (char *)0x0;
  (data_local->req).doh.probe[0].dohbuffer[0x1a0] = (data->set).ftp_use_epsv & 1;
  (data_local->req).doh.probe[0].dohbuffer[0x1a1] = (data->set).ftp_use_eprt & 1;
  (data_local->req).doh.probe[0].dohbuffer[0xfe] = (data->set).ssl.primary.verifystatus & 1;
  (data_local->req).doh.probe[0].dohbuffer[0xfc] = (data->set).ssl.primary.verifypeer & 1;
  (data_local->req).doh.probe[0].dohbuffer[0xfd] = (data->set).ssl.primary.verifyhost & 1;
  (data_local->req).doh.probe[0].dohbuffer[0x14e] = (data->set).proxy_ssl.primary.verifystatus & 1;
  (data_local->req).doh.probe[0].dohbuffer[0x14c] = (data->set).proxy_ssl.primary.verifypeer & 1;
  (data_local->req).doh.probe[0].dohbuffer[0x14d] = (data->set).proxy_ssl.primary.verifyhost & 1;
  *(long *)((data_local->req).doh.probe[0].dohbuffer + 0x1e4) = (data->set).ipver;
  _Var5 = Curl_pipeline_wanted(data->multi,1);
  if ((_Var5) && (*(long *)((data_local->req).doh.probe[1].dohbuffer + 0x7c) == 0)) {
    pvVar3 = (*Curl_ccalloc)(0x4000,1);
    *(void **)((data_local->req).doh.probe[1].dohbuffer + 0x7c) = pvVar3;
    if (*(long *)((data_local->req).doh.probe[1].dohbuffer + 0x7c) != 0) goto LAB_00706de1;
LAB_00706eb1:
    Curl_llist_destroy((curl_llist *)((data_local->req).doh.probe[1].dohbuffer + 0x3c),(void *)0x0);
    Curl_llist_destroy((curl_llist *)((data_local->req).doh.probe[1].dohbuffer + 0x5c),(void *)0x0);
    (*Curl_cfree)(*(void **)((data_local->req).doh.probe[1].dohbuffer + 0x7c));
    (*Curl_cfree)((data_local->set).fsockopt);
    (*Curl_cfree)(*(void **)((data_local->req).doh.probe[0].dohbuffer + 0xe4));
    (*Curl_cfree)(data_local);
    data_local = (Curl_easy *)0x0;
  }
  else {
LAB_00706de1:
    Curl_llist_init((curl_llist *)((data_local->req).doh.probe[1].dohbuffer + 0x3c),llist_dtor);
    Curl_llist_init((curl_llist *)((data_local->req).doh.probe[1].dohbuffer + 0x5c),llist_dtor);
    if ((data->set).str[8] != (char *)0x0) {
      p_Var4 = (curl_sockopt_callback)(*Curl_cstrdup)((data->set).str[8]);
      (data_local->set).fsockopt = p_Var4;
      if ((data_local->set).fsockopt == (curl_sockopt_callback)0x0) goto LAB_00706eb1;
    }
    *(int *)((long)&(data_local->set).sockopt_client + 4) = (data->set).localportrange;
    *(unsigned_short *)&(data_local->set).sockopt_client = (data->set).localport;
    (data_local->msg).list.ptr = (data->set).fclosesocket;
    (data_local->msg).list.prev = (curl_llist_element *)(data->set).closesocket_client;
  }
  return (connectdata *)data_local;
}

Assistant:

static struct connectdata *allocate_conn(struct Curl_easy *data)
{
  struct connectdata *conn = calloc(1, sizeof(struct connectdata));
  if(!conn)
    return NULL;

#ifdef USE_SSL
  /* The SSL backend-specific data (ssl_backend_data) objects are allocated as
     a separate array to ensure suitable alignment.
     Note that these backend pointers can be swapped by vtls (eg ssl backend
     data becomes proxy backend data). */
  {
    size_t sslsize = Curl_ssl->sizeof_ssl_backend_data;
    char *ssl = calloc(4, sslsize);
    if(!ssl) {
      free(conn);
      return NULL;
    }
    conn->ssl_extra = ssl;
    conn->ssl[0].backend = (void *)ssl;
    conn->ssl[1].backend = (void *)(ssl + sslsize);
    conn->proxy_ssl[0].backend = (void *)(ssl + 2 * sslsize);
    conn->proxy_ssl[1].backend = (void *)(ssl + 3 * sslsize);
  }
#endif

  conn->handler = &Curl_handler_dummy;  /* Be sure we have a handler defined
                                           already from start to avoid NULL
                                           situations and checks */

  /* and we setup a few fields in case we end up actually using this struct */

  conn->sock[FIRSTSOCKET] = CURL_SOCKET_BAD;     /* no file descriptor */
  conn->sock[SECONDARYSOCKET] = CURL_SOCKET_BAD; /* no file descriptor */
  conn->tempsock[0] = CURL_SOCKET_BAD; /* no file descriptor */
  conn->tempsock[1] = CURL_SOCKET_BAD; /* no file descriptor */
  conn->connection_id = -1;    /* no ID */
  conn->port = -1; /* unknown at this point */
  conn->remote_port = -1; /* unknown at this point */
#if defined(USE_RECV_BEFORE_SEND_WORKAROUND) && defined(DEBUGBUILD)
  conn->postponed[0].bindsock = CURL_SOCKET_BAD; /* no file descriptor */
  conn->postponed[1].bindsock = CURL_SOCKET_BAD; /* no file descriptor */
#endif /* USE_RECV_BEFORE_SEND_WORKAROUND && DEBUGBUILD */

  /* Default protocol-independent behavior doesn't support persistent
     connections, so we set this to force-close. Protocols that support
     this need to set this to FALSE in their "curl_do" functions. */
  connclose(conn, "Default to force-close");

  /* Store creation time to help future close decision making */
  conn->created = Curl_now();

  /* Store current time to give a baseline to keepalive connection times. */
  conn->keepalive = Curl_now();

  /* Store off the configured connection upkeep time. */
  conn->upkeep_interval_ms = data->set.upkeep_interval_ms;

  conn->data = data; /* Setup the association between this connection
                        and the Curl_easy */

  conn->http_proxy.proxytype = data->set.proxytype;
  conn->socks_proxy.proxytype = CURLPROXY_SOCKS4;

#ifdef CURL_DISABLE_PROXY

  conn->bits.proxy = FALSE;
  conn->bits.httpproxy = FALSE;
  conn->bits.socksproxy = FALSE;
  conn->bits.proxy_user_passwd = FALSE;
  conn->bits.tunnel_proxy = FALSE;

#else /* CURL_DISABLE_PROXY */

  /* note that these two proxy bits are now just on what looks to be
     requested, they may be altered down the road */
  conn->bits.proxy = (data->set.str[STRING_PROXY] &&
                      *data->set.str[STRING_PROXY]) ? TRUE : FALSE;
  conn->bits.httpproxy = (conn->bits.proxy &&
                          (conn->http_proxy.proxytype == CURLPROXY_HTTP ||
                           conn->http_proxy.proxytype == CURLPROXY_HTTP_1_0 ||
                           conn->http_proxy.proxytype == CURLPROXY_HTTPS)) ?
                           TRUE : FALSE;
  conn->bits.socksproxy = (conn->bits.proxy &&
                           !conn->bits.httpproxy) ? TRUE : FALSE;

  if(data->set.str[STRING_PRE_PROXY] && *data->set.str[STRING_PRE_PROXY]) {
    conn->bits.proxy = TRUE;
    conn->bits.socksproxy = TRUE;
  }

  conn->bits.proxy_user_passwd =
    (data->set.str[STRING_PROXYUSERNAME]) ? TRUE : FALSE;
  conn->bits.tunnel_proxy = data->set.tunnel_thru_httpproxy;

#endif /* CURL_DISABLE_PROXY */

  conn->bits.user_passwd = (data->set.str[STRING_USERNAME]) ? TRUE : FALSE;
  conn->bits.ftp_use_epsv = data->set.ftp_use_epsv;
  conn->bits.ftp_use_eprt = data->set.ftp_use_eprt;

  conn->ssl_config.verifystatus = data->set.ssl.primary.verifystatus;
  conn->ssl_config.verifypeer = data->set.ssl.primary.verifypeer;
  conn->ssl_config.verifyhost = data->set.ssl.primary.verifyhost;
  conn->proxy_ssl_config.verifystatus =
    data->set.proxy_ssl.primary.verifystatus;
  conn->proxy_ssl_config.verifypeer = data->set.proxy_ssl.primary.verifypeer;
  conn->proxy_ssl_config.verifyhost = data->set.proxy_ssl.primary.verifyhost;

  conn->ip_version = data->set.ipver;

#if !defined(CURL_DISABLE_HTTP) && defined(USE_NTLM) && \
    defined(NTLM_WB_ENABLED)
  conn->ntlm_auth_hlpr_socket = CURL_SOCKET_BAD;
  conn->ntlm_auth_hlpr_pid = 0;
  conn->challenge_header = NULL;
  conn->response_header = NULL;
#endif

  if(Curl_pipeline_wanted(data->multi, CURLPIPE_HTTP1) &&
     !conn->master_buffer) {
    /* Allocate master_buffer to be used for HTTP/1 pipelining */
    conn->master_buffer = calloc(MASTERBUF_SIZE, sizeof(char));
    if(!conn->master_buffer)
      goto error;
  }

  /* Initialize the pipeline lists */
  Curl_llist_init(&conn->send_pipe, (curl_llist_dtor) llist_dtor);
  Curl_llist_init(&conn->recv_pipe, (curl_llist_dtor) llist_dtor);

#ifdef HAVE_GSSAPI
  conn->data_prot = PROT_CLEAR;
#endif

  /* Store the local bind parameters that will be used for this connection */
  if(data->set.str[STRING_DEVICE]) {
    conn->localdev = strdup(data->set.str[STRING_DEVICE]);
    if(!conn->localdev)
      goto error;
  }
  conn->localportrange = data->set.localportrange;
  conn->localport = data->set.localport;

  /* the close socket stuff needs to be copied to the connection struct as
     it may live on without (this specific) Curl_easy */
  conn->fclosesocket = data->set.fclosesocket;
  conn->closesocket_client = data->set.closesocket_client;

  return conn;
  error:

  Curl_llist_destroy(&conn->send_pipe, NULL);
  Curl_llist_destroy(&conn->recv_pipe, NULL);

  free(conn->master_buffer);
  free(conn->localdev);
#ifdef USE_SSL
  free(conn->ssl_extra);
#endif
  free(conn);
  return NULL;
}